

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall ON_TextureMapping::ReverseTextureCoordinate(ON_TextureMapping *this,int dir)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  ON_Xform *pOVar4;
  double *pdVar5;
  ON_Xform *pOVar6;
  byte bVar7;
  ON_Xform x;
  ON_Xform local_a0;
  
  bVar7 = 0;
  if ((uint)dir < 4) {
    lVar2 = 0x10;
    pdVar3 = (double *)&ON_Xform::IdentityTransformation;
    pdVar5 = (double *)&x;
    for (lVar1 = lVar2; lVar1 != 0; lVar1 = lVar1 + -1) {
      *pdVar5 = *pdVar3;
      pdVar3 = pdVar3 + 1;
      pdVar5 = pdVar5 + 1;
    }
    *(undefined8 *)((long)x.m_xform + (ulong)(uint)dir * 0x28) = 0xbff0000000000000;
    x.m_xform[(uint)dir][3] = 1.0;
    ON_Xform::operator*(&local_a0,&x,&this->m_uvw);
    pOVar4 = &local_a0;
    pOVar6 = &this->m_uvw;
    for (; lVar2 != 0; lVar2 = lVar2 + -1) {
      pOVar6->m_xform[0][0] = pOVar4->m_xform[0][0];
      pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar7 * -2 + 1) * 8);
      pOVar6 = (ON_Xform *)((long)pOVar6 + (ulong)bVar7 * -0x10 + 8);
    }
  }
  return (uint)dir < 4;
}

Assistant:

bool ON_TextureMapping::ReverseTextureCoordinate( int dir )
{
  bool rc = false;
  if ( 0 <= dir && dir <= 3 )
  {
    ON_Xform x(ON_Xform::IdentityTransformation);
    x.m_xform[dir][dir] = -1.0;
    x.m_xform[dir][3] = 1.0;
    m_uvw = x*m_uvw;
    rc = true;
  }
  return rc;
}